

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

int gdImageConvolution(gdImagePtr src,float (*filter) [3],float filter_div,float offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int color;
  gdImagePtr im;
  code *pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint a;
  int iVar10;
  long lVar11;
  long lVar12;
  float (*pafVar13) [3];
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  iVar1 = 0;
  if (src != (gdImagePtr)0x0) {
    im = gdImageCreateTrueColor(src->sx,src->sy);
    if (im != (gdImagePtr)0x0) {
      gdImageSaveAlpha(im,1);
      iVar1 = gdImageColorAllocateAlpha(im,0,0,0,0x7f);
      gdImageFill(im,0,0,iVar1);
      gdImageCopy(im,src,0,0,0,0,src->sx,src->sy);
      if (src->trueColor == 0) {
        pcVar5 = gdImageGetPixel;
      }
      else {
        pcVar5 = gdImageGetTrueColorPixel;
      }
      uVar3 = 0;
      for (lVar14 = 0; lVar14 < src->sy; lVar14 = lVar14 + 1) {
        iVar1 = -1;
        for (lVar11 = 0; lVar11 < src->sx; lVar11 = lVar11 + 1) {
          if (im->trueColor == 0) {
            a = im->alpha[(int)uVar3];
          }
          else {
            a = uVar3 >> 0x18 & 0x7f;
          }
          fVar18 = 0.0;
          fVar17 = 0.0;
          fVar16 = 0.0;
          pafVar13 = filter;
          for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
            iVar2 = (int)lVar14 + -1 + (int)lVar8;
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            iVar10 = src->sy + -1;
            if (iVar2 < iVar10) {
              iVar10 = iVar2;
            }
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              iVar2 = iVar1 + (int)lVar12;
              if (iVar2 < 1) {
                iVar2 = 0;
              }
              iVar9 = src->sx + -1;
              if (iVar2 < iVar9) {
                iVar9 = iVar2;
              }
              uVar3 = (*pcVar5)(im,iVar9,iVar10);
              if (im->trueColor == 0) {
                uVar4 = im->red[(int)uVar3];
              }
              else {
                uVar4 = uVar3 >> 0x10 & 0xff;
              }
              fVar15 = (*pafVar13)[lVar12];
              if (im->trueColor == 0) {
                uVar6 = im->green[(int)uVar3];
                uVar7 = im->blue[(int)uVar3];
              }
              else {
                uVar6 = uVar3 >> 8 & 0xff;
                uVar7 = uVar3 & 0xff;
              }
              fVar17 = fVar17 + (float)(int)uVar6 * fVar15;
              fVar18 = fVar18 + (float)(int)uVar4 * fVar15;
              fVar16 = fVar16 + (float)(int)uVar7 * fVar15;
            }
            pafVar13 = pafVar13 + 1;
          }
          fVar18 = fVar18 / filter_div + offset;
          iVar10 = 0xff;
          iVar2 = 0xff;
          if (fVar18 <= 255.0) {
            fVar15 = 0.0;
            if (0.0 <= fVar18) {
              fVar15 = fVar18;
            }
            iVar2 = (int)fVar15;
          }
          fVar17 = fVar17 / filter_div + offset;
          if (fVar17 <= 255.0) {
            fVar18 = 0.0;
            if (0.0 <= fVar17) {
              fVar18 = fVar17;
            }
            iVar10 = (int)fVar18;
          }
          fVar16 = fVar16 / filter_div + offset;
          iVar9 = 0xff;
          if (fVar16 <= 255.0) {
            fVar17 = 0.0;
            if (0.0 <= fVar16) {
              fVar17 = fVar16;
            }
            iVar9 = (int)fVar17;
          }
          color = gdImageColorAllocateAlpha(src,iVar2,iVar10,iVar9,a);
          if (color == -1) {
            color = gdImageColorClosestAlpha(src,iVar2,iVar10,iVar9,a);
          }
          gdImageSetPixel(src,(int)lVar11,(int)lVar14,color);
          iVar1 = iVar1 + 1;
        }
      }
      gdImageDestroy(im);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageConvolution(gdImagePtr src, float filter[3][3], float filter_div, float offset)
{
	int         x, y, i, j, new_a;
	float       new_r, new_g, new_b;
	int         new_pxl, pxl=0;
	gdImagePtr  srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}

	gdImageSaveAlpha(srcback, 1);
	new_pxl = gdImageColorAllocateAlpha(srcback, 0, 0, 0, 127);
	gdImageFill(srcback, 0, 0, new_pxl);

	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for ( y=0; y<src->sy; y++) {
		for(x=0; x<src->sx; x++) {
			new_r = new_g = new_b = 0;
			new_a = gdImageAlpha(srcback, pxl);

			for (j=0; j<3; j++) {
				int yv = MIN(MAX(y - 1 + j, 0), src->sy - 1);
				for (i=0; i<3; i++) {
				        pxl = f(srcback, MIN(MAX(x - 1 + i, 0), src->sx - 1), yv);
					new_r += (float)gdImageRed(srcback, pxl) * filter[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * filter[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * filter[j][i];
				}
			}

			new_r = (new_r/filter_div)+offset;
			new_g = (new_g/filter_div)+offset;
			new_b = (new_b/filter_div)+offset;

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}